

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  ulong uVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  idx_t local_40;
  bool *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      iVar12 = 0;
      do {
        puVar2 = (undefined8 *)((long)ldata + lVar7 + -8);
        local_50._0_8_ = *puVar2;
        local_50.pointer.ptr = (char *)puVar2[1];
        puVar2 = (undefined8 *)((long)rdata + lVar7 + -8);
        local_60._0_8_ = *puVar2;
        local_60.pointer.ptr = (char *)puVar2[1];
        bVar5 = string_t::operator==((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
        result_data[iVar12] = bVar5;
        iVar12 = iVar12 + 1;
        lVar7 = lVar7 + 0x10;
      } while (count != iVar12);
    }
  }
  else {
    uVar1 = count + 0x3f;
    if (0x3f < uVar1) {
      uVar9 = 0;
      uVar10 = 0;
      local_40 = count;
      do {
        puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar11 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar11 = count;
          }
LAB_00e1e162:
          uVar4 = uVar9;
          if (uVar9 < uVar11) {
            uVar6 = uVar9 << 4 | 8;
            do {
              puVar2 = (undefined8 *)((long)ldata + (uVar6 - 8));
              local_50._0_8_ = *puVar2;
              local_50.pointer.ptr = (char *)puVar2[1];
              puVar2 = (undefined8 *)((long)rdata + (uVar6 - 8));
              local_60._0_8_ = *puVar2;
              local_60.pointer.ptr = (char *)puVar2[1];
              bVar5 = string_t::operator==
                                ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
              result_data[uVar9] = bVar5;
              uVar9 = uVar9 + 1;
              uVar6 = uVar6 + 0x10;
              uVar4 = uVar11;
            } while (uVar11 != uVar9);
          }
        }
        else {
          uVar6 = puVar3[uVar10];
          uVar11 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar11 = count;
          }
          uVar4 = uVar11;
          if (uVar6 != 0) {
            if (uVar6 == 0xffffffffffffffff) goto LAB_00e1e162;
            uVar4 = uVar9;
            if (uVar9 < uVar11) {
              local_38 = result_data + uVar9;
              uVar8 = uVar9 << 4 | 8;
              uVar13 = 0;
              do {
                if ((uVar6 >> (uVar13 & 0x3f) & 1) != 0) {
                  puVar2 = (undefined8 *)((long)ldata + (uVar8 - 8));
                  local_50._0_8_ = *puVar2;
                  local_50.pointer.ptr = (char *)puVar2[1];
                  puVar2 = (undefined8 *)((long)rdata + (uVar8 - 8));
                  local_60._0_8_ = *puVar2;
                  local_60.pointer.ptr = (char *)puVar2[1];
                  bVar5 = string_t::operator==
                                    ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
                  local_38[uVar13] = bVar5;
                }
                uVar13 = uVar13 + 1;
                uVar8 = uVar8 + 0x10;
                uVar4 = uVar11;
                count = local_40;
              } while (uVar11 - uVar9 != uVar13);
            }
          }
        }
        uVar9 = uVar4;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar1 >> 6);
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}